

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<int>,false>
               (DecimalCastData<int> *state,int32_t exponent)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  
  uVar7 = 0;
  uVar2 = (uint)state->decimal_count - (uint)state->scale;
  if (state->decimal_count <= state->scale) {
    uVar2 = uVar7;
  }
  if (exponent < 1) {
    if (exponent < 0) {
      state->exponent_type = NEGATIVE;
      uVar7 = exponent;
    }
  }
  else {
    state->exponent_type = POSITIVE;
    if (uVar2 - exponent == 0 || (int)uVar2 < exponent) {
      uVar7 = exponent - uVar2;
    }
    else {
      state->excessive_decimals = (uint8_t)(uVar2 - exponent);
    }
  }
  bVar1 = Finalize<duckdb::DecimalCastData<int>,false>(state);
  if (bVar1) {
    if ((int)uVar7 < 0) {
      lVar3 = (long)(int)uVar7;
      iVar8 = state->result;
      do {
        iVar4 = iVar8;
        lVar3 = lVar3 + 1;
        iVar8 = iVar4 / 10;
        if (iVar4 + 9U < 0x13) break;
      } while (lVar3 != 0);
      state->result = iVar8;
      bVar1 = true;
      if (4 < iVar4 % 10) {
        state->result = iVar8 + 1;
      }
    }
    else {
      bVar1 = true;
      if (uVar7 != 0) {
        uVar5 = (ulong)uVar7;
        bVar6 = state->digit_count;
        iVar8 = state->result;
        do {
          if (iVar8 == 0) {
            iVar8 = 0;
          }
          else {
            if ((uint)state->width - (uint)state->scale == (uint)bVar6) goto LAB_002a9f1b;
            bVar6 = bVar6 + 1;
            state->digit_count = bVar6;
            if (0xccccccc < iVar8) goto LAB_002a9f1b;
            iVar8 = iVar8 * 10;
            state->result = iVar8;
          }
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
    }
  }
  else {
LAB_002a9f1b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleExponent(T &state, int32_t exponent) {
		auto decimal_excess = (state.decimal_count > state.scale) ? state.decimal_count - state.scale : 0;
		if (exponent > 0) {
			state.exponent_type = ExponentType::POSITIVE;
			// Positive exponents need up to 'exponent' amount of digits
			// Everything beyond that amount needs to be truncated
			if (decimal_excess > exponent) {
				// We've allowed too many decimals
				state.excessive_decimals = UnsafeNumericCast<uint8_t>(decimal_excess - exponent);
				exponent = 0;
			} else {
				exponent -= decimal_excess;
			}
			D_ASSERT(exponent >= 0);
		} else if (exponent < 0) {
			state.exponent_type = ExponentType::NEGATIVE;
		}
		if (!Finalize<T, NEGATIVE>(state)) {
			return false;
		}
		if (exponent < 0) {
			bool round_up = false;
			for (idx_t i = 0; i < idx_t(-int64_t(exponent)); i++) {
				auto mod = state.result % 10;
				round_up = NEGATIVE ? mod <= -5 : mod >= 5;
				state.result /= 10;
				if (state.result == 0) {
					break;
				}
			}
			if (round_up) {
				RoundUpResult<T, NEGATIVE>(state);
			}
			return true;
		} else {
			// positive exponent: append 0's
			for (idx_t i = 0; i < idx_t(exponent); i++) {
				if (!HandleDigit<T, NEGATIVE>(state, 0)) {
					return false;
				}
			}
			return true;
		}
	}